

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

int __thiscall
glcts::TextureCubeMapArraySamplingTest::link
          (TextureCubeMapArraySamplingTest *this,char *__from,char *__to)

{
  int in_EAX;
  int extraout_EAX;
  
  this->linked_programs = this->linked_programs + 1;
  if (*(int *)(__from + 0x30) != 0) {
    in_EAX = programDefinition::link((programDefinition *)__from,__from,__to);
    if ((char)in_EAX == '\0') {
      this->invalid_programs = this->invalid_programs + 1;
      logLinkingLog(this,(programDefinition *)__from);
      logProgram(this,(programDefinition *)__from);
      return extraout_EAX;
    }
  }
  return in_EAX;
}

Assistant:

void TextureCubeMapArraySamplingTest::link(programDefinition& info)
{
	linked_programs += 1;

	/* Not supported format */
	if (programDefinition::m_invalid_program_object_id == info.getProgramId())
	{
		return;
	}

	if (false == info.link())
	{
		invalid_programs += 1;

		logLinkingLog(info);
		logProgram(info);
	}
}